

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O3

Vec_Ptr_t * Saig_ManCollectedDiffNodes(Aig_Man_t *p0,Aig_Man_t *p1)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  
  Aig_ManIncrementTravId(p0);
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(8000);
  pVVar3->pArray = ppvVar4;
  pVVar5 = p0->vObjs;
  if (0 < pVVar5->nSize) {
    iVar10 = 0;
    uVar9 = 1000;
    lVar11 = 0;
    do {
      pAVar1 = (Aig_Obj_t *)pVVar5->pArray[lVar11];
      if (pAVar1 != (Aig_Obj_t *)0x0) {
        if ((p0->pReprs == (Aig_Obj_t **)0x0) ||
           (pAVar2 = p0->pReprs[pAVar1->Id], pAVar2 == (Aig_Obj_t *)0x0)) {
          pAVar1->TravId = p0->nTravIds;
          uVar6 = *(uint *)&pAVar1->field_0x18 & 7;
          if ((uVar6 == 2) || (uVar6 - 5 < 2)) {
            iVar8 = (int)uVar9;
            if (iVar10 == iVar8) {
              if (iVar8 < 0x10) {
                if (pVVar3->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
                }
                pVVar3->pArray = ppvVar4;
                pVVar3->nCap = 0x10;
                uVar9 = 0x10;
              }
              else {
                uVar9 = (ulong)(uint)(iVar8 * 2);
                if (pVVar3->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(uVar9 * 8);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar3->pArray,uVar9 * 8);
                }
                pVVar3->pArray = ppvVar4;
                pVVar3->nCap = iVar8 * 2;
              }
            }
            else {
              ppvVar4 = pVVar3->pArray;
            }
            lVar7 = (long)iVar10;
            iVar10 = iVar10 + 1;
            pVVar3->nSize = iVar10;
            ppvVar4[lVar7] = pAVar1;
            pVVar5 = p0->vObjs;
          }
        }
        else if ((p1->pReprs == (Aig_Obj_t **)0x0) || (pAVar1 != p1->pReprs[pAVar2->Id])) {
          __assert_fail("pObj0 == Aig_ObjRepr( p1, pObj1 )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigWnd.c"
                        ,0x235,"Vec_Ptr_t *Saig_ManCollectedDiffNodes(Aig_Man_t *, Aig_Man_t *)");
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar5->nSize);
  }
  if (0 < (long)p0->nRegs) {
    uVar6 = p0->nTruePos;
    lVar11 = 0;
    do {
      if (((int)uVar6 < 0) || (p0->vCos->nSize <= (int)(uVar6 + (int)lVar11))) {
LAB_006472e4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar9 = (ulong)(uint)p0->nTruePis + lVar11;
      iVar10 = (int)uVar9;
      if ((iVar10 < 0) || (p0->vCis->nSize <= iVar10)) goto LAB_006472e4;
      if ((*(int *)((long)p0->vCis->pArray[uVar9 & 0xffffffff] + 0x20) != p0->nTravIds) ==
          (*(int *)((long)p0->vCos->pArray[(ulong)uVar6 + lVar11] + 0x20) == p0->nTravIds)) {
        __assert_fail("Aig_ObjIsTravIdCurrent(p0, pObj0) == Aig_ObjIsTravIdCurrent(p0, pObj1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigWnd.c"
                      ,0x240,"Vec_Ptr_t *Saig_ManCollectedDiffNodes(Aig_Man_t *, Aig_Man_t *)");
      }
      lVar11 = lVar11 + 1;
    } while (p0->nRegs != lVar11);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Saig_ManCollectedDiffNodes( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // collect nodes that are not linked
    Aig_ManIncrementTravId( p0 );
    vNodes = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr( p0, pObj0 );
        if ( pObj1 != NULL )
        {
            assert( pObj0 == Aig_ObjRepr( p1, pObj1 ) );   
            continue;
        }
        // mark and collect unmatched objects
        Aig_ObjSetTravIdCurrent( p0, pObj0 ); 
        if ( Aig_ObjIsNode(pObj0) || Aig_ObjIsCi(pObj0) )
            Vec_PtrPush( vNodes, pObj0 );
    }
    // make sure LI/LO are labeled/unlabeled mutually
    Saig_ManForEachLiLo( p0, pObj0, pObj1, i )
        assert( Aig_ObjIsTravIdCurrent(p0, pObj0) == 
                Aig_ObjIsTravIdCurrent(p0, pObj1) );
    return vNodes;
}